

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subscriber.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  size_type *psVar1;
  char *__s;
  undefined8 uVar2;
  key_t __key;
  int iVar3;
  size_t sVar4;
  string_view operation_name;
  string_view operation_name_00;
  initializer_list<opentracing::v3::option_wrapper<opentracing::v3::StartSpanOption>_> option_list;
  size_type __dnew;
  shared_ptr<opentracing::v3::Tracer> tracer;
  Node configYAML;
  NullStatsFactory factory;
  Config config;
  StatsFactory local_230;
  pointer local_228;
  _Head_base<0UL,_jaegertracing::logging::Logger_*,_false> local_220;
  undefined1 local_218 [32];
  undefined8 local_1f8;
  pointer local_1f0;
  Node local_1e8;
  undefined **local_1c8;
  Config local_1c0;
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"usage: ",7);
    __s = *argv;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x117280);
    }
    else {
      sVar4 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," <config-yaml-path>\n",0x14);
    iVar3 = 1;
  }
  else {
    std::__cxx11::string::string((string *)&local_1c0,argv[1],(allocator *)local_218);
    YAML::LoadFile((string *)&local_1e8);
    if ((size_type *)local_1c0._0_8_ != &local_1c0._serviceName._M_string_length) {
      operator_delete((void *)local_1c0._0_8_);
    }
    jaegertracing::Config::parse(&local_1c0,&local_1e8);
    local_230._vptr_StatsFactory = (_func_int **)0x12;
    local_218._0_8_ = local_218 + 0x10;
    local_218._0_8_ = std::__cxx11::string::_M_create((ulong *)local_218,(ulong)&local_230);
    local_218._16_8_ = local_230._vptr_StatsFactory;
    *(undefined8 *)local_218._0_8_ = 0x6269726373627573;
    *(undefined8 *)(local_218._0_8_ + 8) = 0x69767265732d7265;
    *(undefined2 *)(local_218._0_8_ + 0x10) = 0x6563;
    local_218._8_8_ = local_230._vptr_StatsFactory;
    *(char *)(local_218._0_8_ + (long)local_230._vptr_StatsFactory) = '\0';
    jaegertracing::logging::consoleLogger();
    std::__shared_ptr<jaegertracing::logging::Logger,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<jaegertracing::logging::Logger,std::default_delete<jaegertracing::logging::Logger>,void>
              ((__shared_ptr<jaegertracing::logging::Logger,(__gnu_cxx::_Lock_policy)2> *)&local_230
               ,(unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
                 *)&local_220);
    local_1c8 = &PTR__StatsFactory_00115b38;
    jaegertracing::Tracer::make
              ((string *)&local_1f8,(Config *)local_218,(shared_ptr *)&local_1c0,&local_230,
               (int)&local_1c8);
    if (local_228 != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228);
    }
    if (local_220._M_head_impl != (Logger *)0x0) {
      (**(code **)(*(long *)local_220._M_head_impl + 8))();
    }
    if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
      operator_delete((void *)local_218._0_8_);
    }
    local_230._vptr_StatsFactory = (_func_int **)local_1f8;
    local_228 = local_1f0;
    if (local_1f0 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        psVar1 = &(local_1f0->_key)._M_string_length;
        *(int *)psVar1 = (int)*psVar1 + 1;
        UNLOCK();
      }
      else {
        psVar1 = &(local_1f0->_key)._M_string_length;
        *(int *)psVar1 = (int)*psVar1 + 1;
      }
    }
    opentracing::v3::Tracer::InitGlobal(local_218,&local_230);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_);
    }
    if (local_228 != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228);
    }
    if (local_1f0 != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0);
    }
    jaegertracing::Config::~Config(&local_1c0);
    if (local_1e8.m_pMemory.
        super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1e8.m_pMemory.
                 super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    opentracing::v3::Tracer::Global();
    operation_name.length_ = (size_t)"setupSubscriberFunction";
    operation_name.data_ = (char *)local_1c0._0_8_;
    opentracing::v3::Tracer::StartSpan
              ((Tracer *)&local_230,operation_name,
               (initializer_list<opentracing::v3::option_wrapper<opentracing::v3::StartSpanOption>_>
               )ZEXT816(0x17));
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        CONCAT44(local_1c0._serviceName._M_dataplus._M_p._4_4_,
                 local_1c0._serviceName._M_dataplus._M_p._0_4_) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 CONCAT44(local_1c0._serviceName._M_dataplus._M_p._4_4_,
                          local_1c0._serviceName._M_dataplus._M_p._0_4_));
    }
    __key = ftok("pub-sub",0x41);
    iVar3 = msgget(__key,0x3b6);
    opentracing::v3::Tracer::Global();
    local_1c0._serviceName._M_string_length = (**(code **)(*local_230._vptr_StatsFactory + 0x50))();
    local_1c0._0_8_ = &PTR__StartSpanOption_00115cd8;
    local_1c0._serviceName._M_dataplus._M_p._0_4_ = 1;
    operation_name_00.length_ = (size_t)"tracedSubscribeSubroutine";
    operation_name_00.data_ = (char *)local_1e8._0_8_;
    option_list._M_len = (size_type)&local_1f8;
    option_list._M_array = (iterator)0x19;
    local_1f8 = &local_1c0;
    opentracing::v3::Tracer::StartSpan((Tracer *)local_218,operation_name_00,option_list);
    if ((pointer)local_1e8.m_pMemory.
                 super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_1e8.m_pMemory.
                 super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
    }
    msgrcv(iVar3,(anonymous_namespace)::message,0x40,1,0);
    uVar2 = local_218._0_8_;
    opentracing::v3::Value::Value<50>
              ((Value *)&local_1c0,(char (*) [50])((anonymous_namespace)::message + 8));
    (**(code **)(*(long *)uVar2 + 0x20))
              (uVar2,"message-recieved",0x10,
               (variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
                *)&local_1c0);
    opentracing::v3::util::
    variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
    ::~variant((variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
                *)&local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Message recieved is: ",0x15);
    sVar4 = strlen((anonymous_namespace)::message + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(anonymous_namespace)::message + 8,sVar4);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    msgctl(iVar3,0,(msqid_ds *)0x0);
    if ((long *)local_218._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_218._0_8_ + 8))();
    }
    if (local_230._vptr_StatsFactory != (_func_int **)0x0) {
      (**(code **)(*local_230._vptr_StatsFactory + 8))();
    }
    opentracing::v3::Tracer::Global();
    (**(code **)(*(undefined **)local_1c0._0_8_ + 0x58))();
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        CONCAT44(local_1c0._serviceName._M_dataplus._M_p._4_4_,
                 local_1c0._serviceName._M_dataplus._M_p._0_4_) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 CONCAT44(local_1c0._serviceName._M_dataplus._M_p._4_4_,
                          local_1c0._serviceName._M_dataplus._M_p._0_4_));
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int main(int argc, char* argv[])
{
    if (argc < 2) {
        std::cerr << "usage: " << argv[0] << " <config-yaml-path>\n";
        return 1;
    }

    setUpTracer(argv[1]);

    setUpSubscriber();

    opentracing::Tracer::Global()->Close();
    return 0;
}